

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O3

bool ON_ModelComponent::UniqueNameRequired(Type component_type)

{
  byte bVar1;
  
  bVar1 = component_type - Image;
  if ((bVar1 < 0x11) && ((0x17fffU >> (bVar1 & 0x1f) & 1) != 0)) {
    bVar1 = (byte)(0x1c6f8 >> (bVar1 & 0x1f));
  }
  else {
    bVar1 = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x807,"","Invalid component_type parameter.");
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ON_ModelComponent::UniqueNameRequired(ON_ModelComponent::Type component_type)
{
  // [Giulio] If this table is changed, then also 
  // Rhino.DocObjects.ModelComponent.ModelComponentTypeRequiresUniqueName()
  // will need the same tweak.

  switch (component_type)
  {
  case ON_ModelComponent::Type::LinePattern:
  case ON_ModelComponent::Type::Layer:
  case ON_ModelComponent::Type::Group:
  case ON_ModelComponent::Type::TextStyle:
  case ON_ModelComponent::Type::DimStyle:
  case ON_ModelComponent::Type::HatchPattern:
  case ON_ModelComponent::Type::InstanceDefinition:
  case ON_ModelComponent::Type::EmbeddedFile:
  case ON_ModelComponent::Type::SectionStyle:
    return true;

  case ON_ModelComponent::Type::Image:
  case ON_ModelComponent::Type::TextureMapping:
  case ON_ModelComponent::Type::Material:
  case ON_ModelComponent::Type::RenderContent: // JohnC: TODO: Giulio's tweak above. Left for the wrapping phase.
  case ON_ModelComponent::Type::RenderLight:
  case ON_ModelComponent::Type::ModelGeometry:
  case ON_ModelComponent::Type::HistoryRecord:
    return false;

  default:
    ON_ERROR("Invalid component_type parameter.");
    return false;
  }
}